

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f * Matrix4f::rotation(Matrix4f *__return_storage_ptr__,Quat4f *q)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Quat4f qq;
  Quat4f local_20;
  
  Quat4f::normalized(q);
  fVar4 = Quat4f::x(&local_20);
  fVar5 = Quat4f::x(&local_20);
  fVar6 = Quat4f::y(&local_20);
  fVar7 = Quat4f::y(&local_20);
  fVar8 = Quat4f::z(&local_20);
  fVar9 = Quat4f::z(&local_20);
  fVar10 = Quat4f::x(&local_20);
  fVar11 = Quat4f::y(&local_20);
  fVar12 = Quat4f::z(&local_20);
  fVar13 = Quat4f::w(&local_20);
  fVar14 = Quat4f::x(&local_20);
  fVar15 = Quat4f::z(&local_20);
  fVar16 = Quat4f::y(&local_20);
  fVar17 = Quat4f::w(&local_20);
  fVar18 = Quat4f::y(&local_20);
  fVar19 = Quat4f::z(&local_20);
  fVar20 = Quat4f::x(&local_20);
  fVar21 = Quat4f::w(&local_20);
  fVar2 = fVar11 * fVar10 - fVar13 * fVar12;
  fVar1 = fVar15 * fVar14 + fVar17 * fVar16;
  fVar10 = fVar13 * fVar12 + fVar11 * fVar10;
  fVar12 = fVar15 * fVar14 - fVar17 * fVar16;
  fVar13 = fVar19 * fVar18 - fVar21 * fVar20;
  fVar11 = fVar19 * fVar18 + fVar21 * fVar20;
  auVar23 = SUB6416(ZEXT464(0x3f800000),0);
  auVar24 = SUB6416(ZEXT464(0xc0000000),0);
  auVar22 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 * fVar6 + fVar9 * fVar8)),auVar24,auVar23);
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar4 + fVar9 * fVar8)),auVar24,auVar23);
  auVar23 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar4 + fVar7 * fVar6)),auVar24,auVar23);
  __return_storage_ptr__->m_elements[0] = auVar22._0_4_;
  __return_storage_ptr__->m_elements[1] = fVar10 + fVar10;
  __return_storage_ptr__->m_elements[2] = fVar12 + fVar12;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = fVar2 + fVar2;
  __return_storage_ptr__->m_elements[5] = auVar3._0_4_;
  __return_storage_ptr__->m_elements[6] = fVar11 + fVar11;
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = fVar1 + fVar1;
  __return_storage_ptr__->m_elements[9] = fVar13 + fVar13;
  __return_storage_ptr__->m_elements[10] = auVar23._0_4_;
  *(undefined1 (*) [16])(__return_storage_ptr__->m_elements + 0xb) = auVar22;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotation( const Quat4f& q )
{
	Quat4f qq = q.normalized();

	float xx = qq.x() * qq.x();
	float yy = qq.y() * qq.y();
	float zz = qq.z() * qq.z();

	float xy = qq.x() * qq.y();
	float zw = qq.z() * qq.w();

	float xz = qq.x() * qq.z();
	float yw = qq.y() * qq.w();

	float yz = qq.y() * qq.z();
	float xw = qq.x() * qq.w();

	return Matrix4f
	(
		1.0f - 2.0f * ( yy + zz ),		2.0f * ( xy - zw ),				2.0f * ( xz + yw ),				0.0f,
		2.0f * ( xy + zw ),				1.0f - 2.0f * ( xx + zz ),		2.0f * ( yz - xw ),				0.0f,
		2.0f * ( xz - yw ),				2.0f * ( yz + xw ),				1.0f - 2.0f * ( xx + yy ),		0.0f,
		0.0f,							0.0f,							0.0f,							1.0f
	);
}